

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
find<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *s)

{
  long lVar1;
  void *pvVar2;
  ulong uVar3;
  undefined8 *in_RDX;
  vector<int,_std::allocator<int>_> copy;
  allocator_type local_39;
  void *local_38;
  void *local_30;
  long local_28;
  
  if ((unsigned_long *)*in_RDX == (unsigned_long *)in_RDX[1]) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
  }
  else {
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&local_38,(unsigned_long *)*in_RDX,
               (unsigned_long *)in_RDX[1],&local_39);
    pvVar2 = local_38;
    if (local_38 != local_30) {
      uVar3 = (long)local_30 - (long)local_38 >> 2;
      lVar1 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_38,local_30,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pvVar2,local_30);
    }
    find_simplex(this,(vector<int,_std::allocator<int>_> *)s);
    if (local_38 != (void *)0x0) {
      operator_delete(local_38,local_28 - (long)local_38);
    }
  }
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }